

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O3

SharedPtr<Decorator> __thiscall
Rml::DecoratorConicGradientInstancer::InstanceDecorator
          (DecoratorConicGradientInstancer *this,String *name,PropertyDictionary *properties_,
          DecoratorInstancerInterface *param_3)

{
  DecoratorConicGradient *pDVar1;
  int iVar2;
  Property *this_00;
  Property *this_01;
  Property *pPVar3;
  Property *pPVar4;
  NumericValue value;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Property *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  Array<const_Property_*,_2> p_position;
  Vector2Numeric VVar6;
  SharedPtr<Decorator> SVar7;
  undefined1 local_4d;
  float local_4c;
  undefined8 local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  PropertyDictionary *local_38;
  
  local_38 = properties_;
  this_00 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[8]);
  this_01 = PropertyDictionary::GetProperty
                      ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[9]);
  pPVar3 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[10]);
  pPVar4 = PropertyDictionary::GetProperty
                     ((PropertyDictionary *)param_3,name[3].field_2._M_local_buf[0xb]);
  _Var5._M_pi = extraout_RDX;
  if ((this_01 == (Property *)0x0 || this_00 == (Property *)0x0) ||
     (pPVar3 == (Property *)0x0 || pPVar4 == (Property *)0x0)) {
LAB_0020ba3f:
    local_48._0_4_ = 0;
    local_48._4_4_ = 0;
    _Stack_40._M_pi._0_4_ = 0;
    _Stack_40._M_pi._4_4_ = 0;
  }
  else {
    value = Property::GetNumericValue(this_00);
    local_4c = ComputeAngle(value);
    p_position._M_elems[1] = extraout_RDX_00;
    p_position._M_elems[0] = pPVar3;
    VVar6 = ComputePosition((Rml *)this_01,p_position);
    iVar2 = ::std::__cxx11::string::compare((char *)local_38);
    _Var5._M_pi = extraout_RDX_01;
    if (pPVar4->unit != COLORSTOPLIST) goto LAB_0020ba3f;
    local_48 = (DecoratorConicGradient *)0x0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Rml::DecoratorConicGradient,std::allocator<Rml::DecoratorConicGradient>>
              (&_Stack_40,(DecoratorConicGradient **)&local_48,
               (allocator<Rml::DecoratorConicGradient> *)&local_4d);
    pDVar1 = local_48;
    local_48->repeating = iVar2 == 0;
    local_48->angle = local_4c;
    local_48->position = VVar6;
    ::std::vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>::operator=
              (&local_48->color_stops,
               (vector<Rml::ColorStop,_std::allocator<Rml::ColorStop>_> *)(pPVar4->value).data);
    _Var5._M_pi = extraout_RDX_02;
    if ((pDVar1->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (pDVar1->color_stops).super__Vector_base<Rml::ColorStop,_std::allocator<Rml::ColorStop>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      (this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (_func_int **)0x0;
      (this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
      super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          CONCAT44(_Stack_40._M_pi._4_4_,_Stack_40._M_pi._0_4_) !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(_Stack_40._M_pi._4_4_,_Stack_40._M_pi._0_4_));
        _Var5._M_pi = extraout_RDX_03;
      }
      goto LAB_0020ba45;
    }
  }
  *(undefined4 *)&(this->super_DecoratorInstancer)._vptr_DecoratorInstancer = (undefined4)local_48;
  *(undefined4 *)((long)&(this->super_DecoratorInstancer)._vptr_DecoratorInstancer + 4) =
       local_48._4_4_;
  *(undefined4 *)
   &(this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
    super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = _Stack_40._M_pi._0_4_;
  *(undefined4 *)
   ((long)&(this->super_DecoratorInstancer).super_EffectSpecification.properties.properties.
           super__Vector_base<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>,_std::allocator<std::unique_ptr<Rml::PropertyDefinition,_std::default_delete<Rml::PropertyDefinition>_>_>_>
           ._M_impl.super__Vector_impl_data + 4) = _Stack_40._M_pi._4_4_;
LAB_0020ba45:
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar7.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorConicGradientInstancer::InstanceDecorator(const String& name, const PropertyDictionary& properties_,
	const DecoratorInstancerInterface& /*interface_*/)
{
	const Property* p_angle = properties_.GetProperty(ids.angle);
	Array<const Property*, 2> p_position = {properties_.GetProperty(ids.position_x), properties_.GetProperty(ids.position_y)};
	const Property* p_color_stop_list = properties_.GetProperty(ids.color_stop_list);

	if (!p_angle || !p_position[0] || !p_position[1] || !p_color_stop_list)
		return nullptr;

	const float angle = ComputeAngle(p_angle->GetNumericValue());
	const Vector2Numeric position = ComputePosition(p_position);
	const bool repeating = (name == "repeating-conic-gradient");

	if (p_color_stop_list->unit != Unit::COLORSTOPLIST)
		return nullptr;
	const ColorStopList& color_stop_list = p_color_stop_list->value.GetReference<ColorStopList>();

	auto decorator = MakeShared<DecoratorConicGradient>();
	if (decorator->Initialise(repeating, angle, position, color_stop_list))
		return decorator;

	return nullptr;
}